

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O3

void __thiscall Pl_ASCII85Decoder::flush(Pl_ASCII85Decoder *this)

{
  uchar *puVar1;
  size_t sVar2;
  Pipeline *pPVar3;
  ulong uVar4;
  int i;
  long lVar5;
  uchar outbuf [4];
  undefined8 uStack_8;
  
  sVar2 = this->pos;
  if (sVar2 != 0) {
    puVar1 = this->inbuf;
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = (ulong)(puVar1[lVar5] - 0x21) + uVar4 * 0x55;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    uStack_8 = (ulong)puVar1 & 0xffffffff;
    lVar5 = 4;
    do {
      *(char *)((long)&uStack_8 + lVar5 + 3) = (char)uVar4;
      uVar4 = uVar4 >> 8;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    this->pos = 0;
    builtin_memcpy(puVar1,"uuuuu",5);
    pPVar3 = (this->super_Pipeline).next_;
    (*pPVar3->_vptr_Pipeline[2])(pPVar3,(long)&uStack_8 + 4,sVar2 - 1);
  }
  return;
}

Assistant:

void
Pl_ASCII85Decoder::flush()
{
    if (this->pos == 0) {
        QTC::TC("libtests", "Pl_ASCII85Decoder no-op flush");
        return;
    }
    unsigned long lval = 0;
    for (int i = 0; i < 5; ++i) {
        lval *= 85;
        lval += (this->inbuf[i] - 33U);
    }

    unsigned char outbuf[4];
    memset(outbuf, 0, 4);
    for (int i = 3; i >= 0; --i) {
        outbuf[i] = lval & 0xff;
        lval >>= 8;
    }

    QTC::TC("libtests", "Pl_ASCII85Decoder partial flush", (this->pos == 5) ? 0 : 1);
    // Reset before calling getNext()->write in case that throws an exception.
    auto t = this->pos - 1;
    this->pos = 0;
    memset(this->inbuf, 117, 5);

    next()->write(outbuf, t);
}